

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_readresp(curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  long *plVar1;
  Curl_easy *data;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  connectdata *conn;
  _Bool _Var5;
  CURLcode CVar6;
  CURLcode CVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  char *buf;
  long lVar12;
  size_t size_00;
  size_t __n;
  ssize_t gotbytes;
  CURLcode local_6c;
  size_t local_60;
  char *local_58;
  curl_socket_t local_4c;
  connectdata *local_48;
  size_t *local_40;
  int *local_38;
  
  local_48 = pp->conn;
  data = local_48->data;
  local_58 = (data->state).buffer;
  *code = 0;
  *size = 0;
  uVar8 = pp->nread_resp;
  uVar10 = (data->set).buffer_size;
  CVar7 = CURLE_OK;
  if (uVar8 < uVar10) {
    buf = local_58 + pp->nread_resp;
    size_00 = (long)buf - (long)pp->linestart_resp;
    bVar4 = true;
    CVar7 = CURLE_OK;
    local_4c = sockfd;
    local_40 = size;
    local_38 = code;
    do {
      if (pp->cache == (char *)0x0) {
        CVar6 = Curl_read(local_48,local_4c,buf,uVar10 - uVar8,(ssize_t *)&local_60);
        if (CVar6 == CURLE_AGAIN) {
          return CURLE_OK;
        }
        CVar7 = CVar6;
        if (0 < (long)local_60) {
          CVar7 = CURLE_OK;
        }
        if (CVar6 != CURLE_OK) {
          CVar7 = CVar6;
        }
        if (CVar7 != CURLE_OK) {
          bVar4 = false;
        }
      }
      else {
        memcpy(buf,pp->cache,pp->cache_size);
        local_60 = pp->cache_size;
        (*Curl_cfree)(pp->cache);
        pp->cache = (char *)0x0;
        pp->cache_size = 0;
      }
      if (bVar4) {
        if ((long)local_60 < 1) {
          bVar4 = false;
          Curl_failf(data,"response reading failed");
          CVar7 = CURLE_RECV_ERROR;
        }
        else {
          plVar1 = &(data->req).headerbytecount;
          *plVar1 = *plVar1 + local_60;
          pp->nread_resp = pp->nread_resp + local_60;
          if ((long)local_60 < 1) {
            lVar12 = 0;
          }
          else {
            lVar12 = 0;
            do {
              conn = local_48;
              size_00 = size_00 + 1;
              if (buf[lVar12] == '\n') {
                if ((data->set).verbose == true) {
                  Curl_debug(data,CURLINFO_HEADER_IN,pp->linestart_resp,size_00,local_48);
                }
                CVar7 = Curl_client_write(conn,2,pp->linestart_resp,size_00);
                if (CVar7 != CURLE_OK) {
                  buf = buf + lVar12;
                  bVar3 = false;
                  local_6c = CVar7;
                  goto LAB_00535564;
                }
                _Var5 = (*pp->endofresp)(conn,pp->linestart_resp,size_00,local_38);
                if (_Var5) {
                  pcVar9 = buf + lVar12;
                  __n = (long)pcVar9 - (long)pp->linestart_resp;
                  memmove(local_58,pp->linestart_resp,__n);
                  local_58[__n] = '\0';
                  pp->linestart_resp = buf + lVar12 + 1;
                  lVar12 = lVar12 + 1;
                  *local_40 = pp->nread_resp;
                  pp->nread_resp = 0;
                  bVar4 = false;
                  CVar7 = CURLE_OK;
                  buf = pcVar9;
                  goto LAB_0053549a;
                }
                pp->linestart_resp = buf + lVar12 + 1;
                size_00 = 0;
                CVar7 = CURLE_OK;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < (long)local_60);
            buf = buf + lVar12;
          }
LAB_0053549a:
          if (bVar4) {
            if ((size_00 == local_60) && ((data->set).buffer_size / 2 < (long)local_60)) {
              Curl_infof(data,
                         "Excessive server response line length received, %zd bytes. Stripping\n");
              bVar2 = true;
              sVar11 = 0x28;
            }
            else {
              uVar8 = (ulong)(data->set).buffer_size >> 1;
              bVar2 = uVar8 < pp->nread_resp;
              sVar11 = 0;
              if (uVar8 < pp->nread_resp) {
                sVar11 = size_00;
              }
            }
          }
          else {
            sVar11 = local_60 - lVar12;
            bVar2 = true;
          }
          if (sVar11 == 0) {
LAB_0053553d:
            bVar3 = true;
            if (bVar2) {
              pp->nread_resp = 0;
              pp->linestart_resp = local_58;
              size_00 = 0;
              buf = local_58;
            }
          }
          else {
            pp->cache_size = sVar11;
            pcVar9 = (char *)(*Curl_cmalloc)(sVar11);
            pp->cache = pcVar9;
            if (pcVar9 != (char *)0x0) {
              memcpy(pcVar9,pp->linestart_resp,pp->cache_size);
              goto LAB_0053553d;
            }
            local_6c = CURLE_OUT_OF_MEMORY;
            bVar3 = false;
          }
LAB_00535564:
          if (!bVar3) {
            return local_6c;
          }
        }
      }
      uVar8 = pp->nread_resp;
      uVar10 = (data->set).buffer_size;
    } while (((uVar8 < uVar10) && (bVar4)) && (CVar7 == CURLE_OK));
  }
  pp->pending_resp = false;
  return CVar7;
}

Assistant:

CURLcode Curl_pp_readresp(curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon=TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data = conn->data;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr=buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp < (size_t)data->set.buffer_size) &&
        (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      DEBUGASSERT((ptr+pp->cache_size) <= (buf+data->set.buffer_size+1));
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr + data->set.buffer_size - pp->nread_resp) <=
                  (buf + data->set.buffer_size + 1));
      result = Curl_read(conn, sockfd, ptr,
                         data->set.buffer_size - pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(!result && (gotbytes > 0))
        /* convert from the network encoding */
        result = Curl_convert_from_network(data, ptr, gotbytes);
      /* Curl_convert_from_network calls failf if unsuccessful */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed");
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr=='\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            if(data->set.verbose)
              Curl_debug(data, CURLINFO_HEADER_IN,
                         pp->linestart_resp, (size_t)perline, conn);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and zero terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n]=0; /* zero terminate */
            keepon=FALSE;
            pp->linestart_resp = ptr+1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline=0; /* line starts over here */
          pp->linestart_resp = ptr+1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left\n",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) && (gotbytes > data->set.buffer_size/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping\n", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > (size_t)data->set.buffer_size/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}